

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwttests.c
# Opt level: O2

double absmax(double *array,int N)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  dVar4 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar3 = -(ulong)(dVar4 <= ABS(array[uVar1]));
    dVar4 = (double)(~uVar3 & (ulong)dVar4 | (ulong)ABS(array[uVar1]) & uVar3);
  }
  return dVar4;
}

Assistant:

double absmax(double *array, int N) {
	double max;
	int i;

	max = 0.0;
	for (i = 0; i < N; ++i) {
		if (fabs(array[i]) >= max) {
			max = fabs(array[i]);
		}
	}

	return max;
}